

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileTests.cpp
# Opt level: O0

void __thiscall
solitaire::piles::StockPileWithCardsTest_tryPullOutSecondCard_Test::TestBody
          (StockPileWithCardsTest_tryPullOutSecondCard_Test *this)

{
  bool bVar1;
  reference pCVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  char *pcVar4;
  undefined4 extraout_var_00;
  undefined1 extraout_DL;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  *matcher;
  Cards *this_00;
  shared_ptr<solitaire::piles::StockPile> *this_01;
  AssertHelper local_108;
  Message local_100;
  int local_f4;
  _Optional_payload_base<unsigned_int> local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_2;
  Message local_d0;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  local_c8;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  local_b0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [3];
  _Storage<solitaire::cards::Card,_true> local_68;
  undefined4 local_60;
  _Storage<solitaire::cards::Card,_true> local_58;
  undefined4 local_50;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  const_iterator local_30;
  Card local_28;
  Card secondCard;
  __normal_iterator<solitaire::cards::Card_*,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  local_18;
  __normal_iterator<solitaire::cards::Card_*,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  secondCardIt;
  StockPileWithCardsTest_tryPullOutSecondCard_Test *this_local;
  
  this_00 = &(this->super_StockPileWithCardsTest).pileCards;
  secondCardIt._M_current = (Card *)this;
  secondCard = (Card)std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::
                     begin(this_00);
  local_18 = std::
             next<__gnu_cxx::__normal_iterator<solitaire::cards::Card*,std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>
                       ((__normal_iterator<solitaire::cards::Card_*,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
                         )secondCard,1);
  pCVar2 = __gnu_cxx::
           __normal_iterator<solitaire::cards::Card_*,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
           ::operator*(&local_18);
  local_28 = *pCVar2;
  __gnu_cxx::
  __normal_iterator<solitaire::cards::Card_const*,std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
  ::__normal_iterator<solitaire::cards::Card*>
            ((__normal_iterator<solitaire::cards::Card_const*,std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
              *)&local_30,&local_18);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::erase
                   (this_00,local_30);
  this_01 = &(this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile;
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
  (*(peVar3->super_StockPile).super_Archiver._vptr_Archiver[4])();
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
  (*(peVar3->super_StockPile).super_Archiver._vptr_Archiver[4])();
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
  local_68._0_4_ = (*(peVar3->super_StockPile).super_Archiver._vptr_Archiver[5])();
  local_68._M_value.suit = extraout_var;
  local_60 = CONCAT31(local_60._1_3_,extraout_DL);
  local_50 = local_60;
  local_58 = local_68;
  testing::internal::EqHelper::
  Compare<std::optional<solitaire::cards::Card>,_solitaire::cards::Card,_nullptr>
            ((EqHelper *)local_48,"pile->tryPullOutCard()","secondCard",
             (optional<solitaire::cards::Card> *)&local_58._M_value,&local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x5e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  testing::ContainerEq<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            (&local_c8,(testing *)&(this->super_StockPileWithCardsTest).pileCards,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
            (&local_b0,(internal *)&local_c8,matcher);
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile);
  (*(peVar3->super_StockPile).super_Archiver._vptr_Archiver[6])();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(local_98,(char *)&local_b0,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "pile->getCards()");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_b0);
  testing::
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  ::~PolymorphicMatcher(&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x5f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile);
  local_f0._M_payload._M_value = (*(peVar3->super_StockPile).super_Archiver._vptr_Archiver[7])();
  local_f0._4_4_ = extraout_var_00;
  local_f4 = 0;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_int,_nullptr>
            ((EqHelper *)local_e8,"pile->getSelectedCardIndex()","0",
             (optional<unsigned_int> *)&local_f0,&local_f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x60,pcVar4);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  return;
}

Assistant:

TEST_F(StockPileWithCardsTest, tryPullOutSecondCard) {
    const auto secondCardIt = std::next(pileCards.begin());
    const auto secondCard = *secondCardIt;
    pileCards.erase(secondCardIt);

    pile->trySelectNextCard();
    pile->trySelectNextCard();

    EXPECT_EQ(pile->tryPullOutCard(), secondCard);
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
    EXPECT_EQ(pile->getSelectedCardIndex(), 0);
}